

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean.c
# Opt level: O0

BoolExpr * BO_not(List *ls)

{
  BoolExpr *subexpr_00;
  BoolExpr *subexpr;
  List *ls_local;
  
  subexpr_00 = make_boolean_expr(ls->cdr);
  if (subexpr_00 == (BoolExpr *)0x0) {
    parse_error(ls,"not takes an argument!\n");
    ls_local = (List *)&false_bool_expr;
  }
  else if (subexpr_00->type == E_FALSE) {
    ls_local = (List *)&true_bool_expr;
  }
  else if (subexpr_00->type == E_TRUE) {
    ls_local = (List *)&false_bool_expr;
  }
  else {
    ls_local = (List *)create_bool_expr(E_NOT,subexpr_00);
  }
  return (BoolExpr *)ls_local;
}

Assistant:

static BoolExpr *
BO_not (const List *ls)
{
  BoolExpr *subexpr = make_boolean_expr (ls->cdr);

  if (subexpr == NULL)
    {
      parse_error(ls, "not takes an argument!\n");
      return &false_bool_expr;  /* default = FALSE */
    }
  if (subexpr->type == E_FALSE) return &true_bool_expr;
  if (subexpr->type == E_TRUE ) return &false_bool_expr;
  return create_bool_expr (E_NOT, subexpr);
}